

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

SharedPtr<deqp::egl::GLES2ThreadTest::Shader> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popShader(GLES2ResourceManager *this,int index)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> SVar2;
  
  lVar1 = CONCAT44(in_register_00000034,index);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)this,
             (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)
             (*(long *)(lVar1 + 0x30) + (long)in_EDX * 0x10));
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
  ::erase((vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>_>_>
           *)(lVar1 + 0x30),
          (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)
          ((long)in_EDX * 0x10 + *(long *)(lVar1 + 0x30)));
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = (Shader *)this;
  return SVar2;
}

Assistant:

SharedPtr<Shader> GLES2ResourceManager::popShader (int index)
{
	SharedPtr<Shader> shader = m_shaders[index];

	m_shaders.erase(m_shaders.begin() + index);

	return shader;
}